

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O3

void uv__run_timers(uv_loop_t *loop)

{
  uv__queue *puVar1;
  uv__queue *puVar2;
  int iVar3;
  heap *heap;
  heap_node *q;
  undefined1 local_38 [8];
  uv__queue ready_queue;
  uv__queue *queue_node;
  uv_timer_t *handle;
  heap_node *heap_node;
  uv_loop_t *loop_local;
  
  uv__queue_init((uv__queue *)local_38);
  while( true ) {
    heap = timer_heap(loop);
    q = heap_min(heap);
    if ((q == (heap_node *)0x0) || ((heap_node *)loop->time < q[1].left)) break;
    timer_stop((uv_timer_t *)&q[-5].parent);
    uv__queue_insert_tail((uv__queue *)local_38,(uv__queue *)q);
  }
  while (iVar3 = uv__queue_empty((uv__queue *)local_38), iVar3 == 0) {
    ready_queue.prev = uv__queue_head((uv__queue *)local_38);
    uv__queue_remove(ready_queue.prev);
    uv__queue_init(ready_queue.prev);
    puVar2 = ready_queue.prev;
    puVar1 = ready_queue.prev + -7;
    uv_timer_again((uv_timer_t *)&puVar1->prev);
    (*(code *)puVar2[-1].prev)(&puVar1->prev);
  }
  return;
}

Assistant:

void uv__run_timers(uv_loop_t* loop) {
  struct heap_node* heap_node;
  uv_timer_t* handle;
  struct uv__queue* queue_node;
  struct uv__queue ready_queue;

  uv__queue_init(&ready_queue);

  for (;;) {
    heap_node = heap_min(timer_heap(loop));
    if (heap_node == NULL)
      break;

    handle = container_of(heap_node, uv_timer_t, node.heap);
    if (handle->timeout > loop->time)
      break;

    timer_stop(handle);
    uv__queue_insert_tail(&ready_queue, &handle->node.queue);
  }

  while (!uv__queue_empty(&ready_queue)) {
    queue_node = uv__queue_head(&ready_queue);
    uv__queue_remove(queue_node);
    uv__queue_init(queue_node);
    handle = container_of(queue_node, uv_timer_t, node.queue);

    uv_timer_again(handle);
    handle->timer_cb(handle);
  }
}